

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateNonNestedInitializationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  int iVar2;
  long *plVar3;
  int i;
  FieldDescriptor *in_RDX;
  string local_50;
  string local_30;
  
  iVar2 = 0;
  if (*(long *)((java *)this->descriptor_ + 0x68) == 0) {
    UnderscoresToCamelCase_abi_cxx11_(&local_30,(java *)this->descriptor_,in_RDX);
    pFVar1 = this->descriptor_;
    if (pFVar1[0x50] == (FieldDescriptor)0x0) {
      plVar3 = (long *)(*(long *)(pFVar1 + 0x58) + 0x30);
    }
    else if (*(long *)(pFVar1 + 0x68) == 0) {
      plVar3 = (long *)(*(long *)(pFVar1 + 0x30) + 0x98);
    }
    else {
      plVar3 = (long *)(*(long *)(pFVar1 + 0x68) + 0x80);
    }
    SimpleItoa_abi_cxx11_
              (&local_50,
               (protobuf *)(ulong)(uint)((int)((ulong)((long)pFVar1 - *plVar3) >> 3) * 0x3cf3cf3d),i
              );
    io::Printer::Print(printer,"$name$.internalInit(descriptor.getExtensions().get($index$));\n",
                       "name",&local_30,"index",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    iVar2 = 0x15;
  }
  return iVar2;
}

Assistant:

int ImmutableExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  if (descriptor_->extension_scope() == NULL) {
    // Only applies to non-nested extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCase(descriptor_),
        "index", SimpleItoa(descriptor_->index()));
    bytecode_estimate += 21;
  }
  return bytecode_estimate;
}